

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O1

void __thiscall Diligent::ThreadPoolImpl::~ThreadPoolImpl(ThreadPoolImpl *this)

{
  char (*in_RCX) [30];
  string msg;
  string local_30;
  
  StopThreads(this);
  if ((this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    FormatString<char[26],char[21]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_TasksQueue.empty()",(char (*) [21])in_RCX);
    in_RCX = (char (*) [30])0x145;
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~ThreadPoolImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0x145);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->m_NumRunningTasks).super___atomic_base<int>._M_i != 0) {
    FormatString<char[26],char[30]>
              (&local_30,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_NumRunningTasks.load() == 0",in_RCX);
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"~ThreadPoolImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/ThreadPool.cpp"
               ,0x146);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  std::condition_variable::~condition_variable(&this->m_TasksFinishedCond);
  std::condition_variable::~condition_variable(&this->m_NextTaskCond);
  std::
  vector<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::allocator<std::pair<float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::~vector(&this->m_ReprioritizationList);
  std::
  _Rb_tree<float,_std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>,_std::_Select1st<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>,_std::greater<float>,_std::allocator<std::pair<const_float,_Diligent::ThreadPoolImpl::QueuedTaskInfo>_>_>
  ::~_Rb_tree(&(this->m_TasksQueue)._M_t);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->m_WorkerThreads);
  return;
}

Assistant:

~ThreadPoolImpl()
    {
        StopThreads();
        VERIFY_EXPR(m_TasksQueue.empty());
        VERIFY_EXPR(m_NumRunningTasks.load() == 0);
    }